

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O2

void container_add_offset_test(void **state_)

{
  container_t **lo;
  container_t **hi;
  container_t **hi_00;
  container_t **lo_00;
  uint8_t type;
  ushort offset;
  void *pvVar1;
  ushort *puVar2;
  unsigned_long a;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  uint uVar8;
  
  pvVar1 = *state_;
  puVar2 = *(ushort **)((long)pvVar1 + 8);
  a = *(unsigned_long *)((long)pvVar1 + 0x10);
  offset = *(ushort *)((long)pvVar1 + 0x18);
  type = *(uint8_t *)((long)pvVar1 + 0x1a);
  _assert_true((ulong)(a != 0),"test.n_values > 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x6e);
  lo = (container_t **)((long)pvVar1 + 0x28);
  hi = (container_t **)((long)pvVar1 + 0x30);
  container_add_offset(*(container_t **)((long)pvVar1 + 0x20),type,lo,hi,offset);
  hi_00 = (container_t **)((long)pvVar1 + 0x40);
  iVar4 = 0;
  container_add_offset(*(container_t **)((long)pvVar1 + 0x20),type,(container_t **)0x0,hi_00,offset)
  ;
  lo_00 = (container_t **)((long)pvVar1 + 0x38);
  uVar8 = (uint)offset;
  container_add_offset(*(container_t **)((long)pvVar1 + 0x20),type,lo_00,(container_t **)0x0,offset)
  ;
  if (*puVar2 + uVar8 < 0x10000) {
    _assert_true(*(unsigned_long *)((long)pvVar1 + 0x28),"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x78);
    _assert_true((unsigned_long)*lo_00,"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x79);
    _Var3 = container_equals(*lo,type,*lo_00,type);
    _assert_true((ulong)_Var3,"container_equals(state->lo, type, state->lo_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7a);
    iVar4 = container_get_cardinality(*lo,type);
  }
  else {
    _assert_true((ulong)(*(unsigned_long *)((long)pvVar1 + 0x28) == 0),"state->lo",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x75);
    _assert_true((ulong)(*lo_00 == (container_t *)0x0),"state->lo_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x76);
  }
  if (puVar2[a - 1] + uVar8 < 0x10000) {
    _assert_true((ulong)(*hi == (container_t *)0x0),"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7e);
    _assert_true((ulong)(*hi_00 == (container_t *)0x0),"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x7f);
    iVar5 = 0;
  }
  else {
    _assert_true((unsigned_long)*hi,"state->hi",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x81);
    _assert_true((unsigned_long)*hi_00,"state->hi_only",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x82);
    _Var3 = container_equals(*hi,type,*hi_00,type);
    _assert_true((ulong)_Var3,"container_equals(state->hi, type, state->hi_only, type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x83);
    iVar5 = container_get_cardinality(*hi,type);
  }
  _assert_int_equal(a,(long)(iVar5 + iVar4),
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                    ,0x87);
  uVar6 = 0;
  while ((uVar7 = a, a != uVar6 && (uVar7 = uVar6, puVar2[uVar6] + uVar8 < 0x10000))) {
    _Var3 = container_contains(*lo,(uint16_t)(puVar2[uVar6] + uVar8),type);
    _assert_true((ulong)_Var3,"container_contains(state->lo, offset + test.values[i], type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x8d);
    uVar6 = uVar6 + 1;
  }
  for (; uVar7 < a; uVar7 = uVar7 + 1) {
    _Var3 = container_contains(*hi,puVar2[uVar7] + offset,type);
    _assert_true((ulong)_Var3,"container_contains(state->hi, offset + test.values[i], type)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x91);
  }
  return;
}

Assistant:

static void container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    uint16_t offset = test.offset;
    uint8_t type = test.type;
    int card_lo = 0, card_hi = 0;

    assert_true(test.n_values > 0);

    container_add_offset(state->in, type, &state->lo, &state->hi, offset);
    container_add_offset(state->in, type, NULL, &state->hi_only, offset);
    container_add_offset(state->in, type, &state->lo_only, NULL, offset);

    if ((int)offset + test.values[0] > UINT16_MAX) {
        assert_null(state->lo);
        assert_null(state->lo_only);
    } else {
        assert_non_null(state->lo);
        assert_non_null(state->lo_only);
        assert_true(container_equals(state->lo, type, state->lo_only, type));
        card_lo = container_get_cardinality(state->lo, type);
    }
    if ((int)offset + test.values[test.n_values - 1] <= UINT16_MAX) {
        assert_null(state->hi);
        assert_null(state->hi_only);
    } else {
        assert_non_null(state->hi);
        assert_non_null(state->hi_only);
        assert_true(container_equals(state->hi, type, state->hi_only, type));
        card_hi = container_get_cardinality(state->hi, type);
    }

    assert_int_equal(test.n_values, card_lo + card_hi);

    size_t i = 0;
    for (; i < test.n_values && (int)offset + test.values[i] <= UINT16_MAX;
         i++) {
        assert_true(
            container_contains(state->lo, offset + test.values[i], type));
    }
    for (; i < test.n_values; i++) {
        assert_true(
            container_contains(state->hi, offset + test.values[i], type));
    }
}